

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

BVSparseNode * __thiscall
BVSparse<Memory::JitArenaAllocator>::NodeFromIndex
          (BVSparse<Memory::JitArenaAllocator> *this,BVIndex i,Type **prevNextFieldOut)

{
  Type_conflict *ppBVar1;
  uint uVar2;
  BVSparse<Memory::JitArenaAllocator> *pBVar3;
  uint uVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  uint uVar6;
  BVSparse<Memory::JitArenaAllocator> *pBVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  
  uVar4 = i & 0xffffffc0;
  ppBVar1 = &this->lastFoundIndex;
  pBVar3 = (BVSparse<Memory::JitArenaAllocator> *)this->head;
  pBVar5 = this;
  if (pBVar3 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    uVar6 = *(uint *)&pBVar3->lastFoundIndex;
    if (uVar6 == uVar4) goto LAB_003de69e;
    pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)this->lastFoundIndex;
    pBVar7 = pBVar3;
    if ((pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
       (uVar2 = *(uint *)&pBVar8->lastFoundIndex, uVar2 != uVar6)) {
      if (uVar2 == uVar4) {
        *prevNextFieldOut = ppBVar1;
        return (BVSparseNode *)pBVar8;
      }
      pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)ppBVar1;
      if (uVar4 <= uVar2) {
        pBVar8 = pBVar3;
        pBVar5 = this;
      }
      uVar6 = *(uint *)&pBVar8->lastFoundIndex;
      pBVar7 = pBVar8;
    }
    if (uVar4 < uVar6) {
      pBVar7 = pBVar3;
      pBVar5 = this;
    }
  }
  while( true ) {
    pBVar3 = pBVar7;
    if (pBVar3 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      *ppBVar1 = pBVar5->head;
      return (BVSparseNode *)0x0;
    }
    uVar6 = *(uint *)&pBVar3->lastFoundIndex;
    if (uVar4 <= uVar6) break;
    pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)pBVar3->head;
    pBVar5 = pBVar3;
  }
  *ppBVar1 = pBVar5->head;
  if (uVar4 != uVar6) {
    return (BVSparseNode *)0x0;
  }
LAB_003de69e:
  *prevNextFieldOut = &pBVar5->head;
  return (BVSparseNode *)pBVar3;
}

Assistant:

const BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator) const** prevNextFieldOut) const
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator) const* prevNextField = &this->head;
    Field(BVSparseNode*, TAllocator) const* prevLastField = &this->lastFoundIndex;

    const BVSparseNode * curNode  = *prevNextField,
                       * lastNode = *prevLastField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (lastNode && lastNode->startIndex != curNode->startIndex)
        {
            if (lastNode->startIndex == searchIndex)
            {
                *prevNextFieldOut = prevLastField;
                return lastNode;
            }

            if (lastNode->startIndex < searchIndex)
            {
                prevNextField = &this->lastFoundIndex;
                curNode = this->lastFoundIndex;
            }
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    const_cast<BVSparse<TAllocator>*>(this)->lastFoundIndex = *prevNextField;

    if (curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        return curNode;
    }

    return nullptr;
}